

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::Lower(Lowerer *this)

{
  LowererMD *this_00;
  Func *pFVar1;
  Instr *pIVar2;
  Opnd *this_01;
  Instr *pIVar3;
  Instr *pIVar4;
  BVSparseNode<Memory::JitArenaAllocator> *pBVar5;
  Type pBVar6;
  code *pcVar7;
  BVSparseNode<Memory::JitArenaAllocator> *pBVar8;
  bool bVar9;
  bool defaultDoLoopFastPath;
  bool bVar10;
  OpndKind OVar11;
  int32 iVar12;
  RegSlot RVar13;
  RegSlot RVar14;
  undefined4 *puVar15;
  StackSym *pSVar16;
  SymOpnd *pSVar17;
  IntConstOpnd *pIVar18;
  Instr *pIVar19;
  JITTimeFunctionBody *pJVar20;
  BVSparseNode *pBVar21;
  BVSparseNode *pBVar22;
  int slotId;
  undefined1 local_110 [8];
  NoRecoverMemoryJitArenaAllocator localAlloc;
  BVSparse<Memory::JitArenaAllocator> localInitializedTempSym;
  BVSparse<Memory::JitArenaAllocator> localAddToLiveOnBackEdgeSyms;
  
  pFVar1 = this->m_func;
  pFVar1->topFunc->maintainByteCodeOffset = false;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_110,
             L"BE-Lower",
             (pFVar1->m_alloc->super_ArenaAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             super_ArenaData.pageAllocator,Js::Throw::OutOfMemory,(_func_void *)0x0);
  localAlloc.super_JitArenaAllocator.super_ArenaAllocator.
  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList = (void *)0x0;
  this->m_alloc = (JitArenaAllocator *)local_110;
  localInitializedTempSym.alloc = (Type)&localAlloc.super_JitArenaAllocator.bvFreeList;
  localAlloc.super_JitArenaAllocator.bvFreeList = (BVSparseNode *)0x0;
  localInitializedTempSym.head = (Type_conflict)0x0;
  this->initializedTempSym = (BVSparse<Memory::JitArenaAllocator> *)localInitializedTempSym.alloc;
  localInitializedTempSym.lastUsedNodePrevNextField = (Type)0x0;
  this->addToLiveOnBackEdgeSyms =
       (BVSparse<Memory::JitArenaAllocator> *)&localInitializedTempSym.lastUsedNodePrevNextField;
  localInitializedTempSym.lastFoundIndex = (Type_conflict)local_110;
  if (this->m_func->topFunc->m_cloneMap != (InstrMap *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar15 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2a,"(this->m_func->GetCloneMap() == nullptr)",
                       "this->m_func->GetCloneMap() == nullptr");
    if (!bVar9) goto LAB_00596a3c;
    *puVar15 = 0;
  }
  this_00 = &this->m_lowererMD;
  LowererMD::Init(this_00,this);
  bVar9 = Func::DoFastPaths(this->m_func);
  defaultDoLoopFastPath = Func::DoLoopFastPaths(this->m_func);
  if (this->m_func->hasAnyStackNestedFunc == true) {
    EnsureStackFunctionListStackSym(this);
  }
  if ((this->m_func->stackClosure == true) &&
     (bVar10 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem), !bVar10)) {
    AllocStackClosure(this);
  }
  AllocStackForInObjectEnumeratorArray(this);
  bVar10 = Func::IsJitInDebugMode(this->m_func);
  if (bVar10) {
    iVar12 = Func::GetHasLocalVarChangedOffset(this->m_func);
    if (iVar12 != -1) {
      pSVar16 = StackSym::New(TyInt8,this->m_func);
      pSVar16->m_offset = iVar12;
      pSVar16->field_0x19 = pSVar16->field_0x19 | 0x10;
      pSVar17 = IR::SymOpnd::New(&pSVar16->super_Sym,TyInt8,this->m_func);
      pIVar18 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
      pIVar19 = Func::GetFunctionEntryInsertionPoint(this->m_func);
      InsertMove(&pSVar17->super_Opnd,&pIVar18->super_Opnd,pIVar19,true);
      pJVar20 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      RVar13 = JITTimeFunctionBody::GetEndNonTempLocalIndex(pJVar20);
      pJVar20 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      RVar14 = JITTimeFunctionBody::GetFirstNonTempLocalIndex(pJVar20);
      if (RVar13 != RVar14) {
        slotId = 0;
        do {
          iVar12 = Func::GetLocalVarSlotOffset(this->m_func,slotId);
          pIVar18 = IR::IntConstOpnd::New(-0x3131313131313132,TyInt64,this->m_func,false);
          pSVar16 = StackSym::New(TyInt64,this->m_func);
          pSVar16->m_offset = iVar12;
          pSVar16->field_0x19 = pSVar16->field_0x19 | 0x10;
          pSVar17 = IR::SymOpnd::New(&pSVar16->super_Sym,TyInt64,this->m_func);
          pIVar19 = Func::GetFunctionEntryInsertionPoint(this->m_func);
          InsertMove(&pSVar17->super_Opnd,&pIVar18->super_Opnd,pIVar19,true);
          slotId = slotId + 1;
        } while (RVar13 - RVar14 != slotId);
      }
    }
    if (this->m_func->hasAnyStackNestedFunc == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar15 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                          ,0x66,"(!m_func->HasAnyStackNestedFunc())",
                          "!m_func->HasAnyStackNestedFunc()");
      if (!bVar10) {
LAB_00596a3c:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar15 = 0;
    }
  }
  LowerRange(this,this->m_func->m_headInstr,this->m_func->m_tailInstr,bVar9,defaultDoLoopFastPath);
  if (((DAT_015d641e == '\x01') && (DAT_015d641f == '\x01')) &&
     (pIVar19 = this->m_func->m_headInstr, pIVar19 != (Instr *)0x0)) {
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      pIVar2 = pIVar19->m_next;
      if ((pIVar19->m_src1 != (Opnd *)0x0) &&
         (OVar11 = IR::Opnd::GetKind(pIVar19->m_src1), OVar11 == OpndKindAddr)) {
        this_01 = pIVar19->m_src1;
        OVar11 = IR::Opnd::GetKind(this_01);
        if (OVar11 != OpndKindAddr) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar15 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
          if (!bVar9) goto LAB_00596a3c;
          *puVar15 = 0;
        }
        if (*(byte *)((long)&this_01[2].m_valueType.field_0.bits + 1) == 0x24) {
          pIVar3 = pIVar19->m_prev;
          pIVar4 = pIVar3->m_prev;
          if (pIVar4->m_prev->m_opcode != LEA) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x7b,"(leaInstr->m_opcode == Js::OpCode::LEA)",
                               "leaInstr->m_opcode == Js::OpCode::LEA");
            if (!bVar9) goto LAB_00596a3c;
            *puVar15 = 0;
          }
          if (pIVar3->m_prev->m_opcode != MOV) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x7c,"(movInstr->m_opcode == Js::OpCode::MOV)",
                               "movInstr->m_opcode == Js::OpCode::MOV");
            if (!bVar9) goto LAB_00596a3c;
            *puVar15 = 0;
          }
          if (pIVar19->m_prev->m_opcode != SHR) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x7d,"(shrInstr->m_opcode == Js::OpCode::SHR)",
                               "shrInstr->m_opcode == Js::OpCode::SHR");
            if (!bVar9) goto LAB_00596a3c;
            *puVar15 = 0;
          }
          LowererMD::LoadHelperArgument(this_00,pIVar3->m_prev,pIVar4->m_prev->m_dst);
          pIVar19 = IR::Instr::New(Call,this->m_func);
          IR::Instr::InsertBefore(pIVar3->m_prev,pIVar19);
          LowererMD::ChangeToHelperCall
                    (this_00,pIVar19,HelperWriteBarrierSetVerifyBit,(LabelInstr *)0x0,(Opnd *)0x0,
                     (PropertySymOpnd *)0x0,false);
        }
      }
      pIVar19 = pIVar2;
    } while (pIVar2 != (Instr *)0x0);
  }
  Func::ClearCloneMap(this->m_func);
  if (this->m_func->hasAnyStackNestedFunc == true) {
    EnsureZeroLastStackFunctionNext(this);
  }
  JITTimeWorkItem::GetJitMode(this->m_func->m_workItem);
  this->initializedTempSym = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->m_alloc = (JitArenaAllocator *)0x0;
  this->m_func->canHoistConstantAddressLoad = false;
  pBVar8 = (BVSparseNode<Memory::JitArenaAllocator> *)
           localInitializedTempSym.lastUsedNodePrevNextField;
  while (pBVar8 != (BVSparseNode<Memory::JitArenaAllocator> *)0x0) {
    pBVar5 = pBVar8->next;
    pBVar8->next = (Type)localAlloc.super_JitArenaAllocator.super_ArenaAllocator.
                         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                         freeList;
    localAlloc.super_JitArenaAllocator.super_ArenaAllocator.
    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList = pBVar8;
    pBVar8 = pBVar5;
  }
  if (localAlloc.super_JitArenaAllocator.bvFreeList != (BVSparseNode *)0x0) {
    pBVar6 = localAlloc.super_JitArenaAllocator.bvFreeList;
    pBVar22 = *(BVSparseNode **)&localInitializedTempSym.lastFoundIndex[5].startIndex;
    do {
      pBVar21 = pBVar6;
      pBVar6 = pBVar21->next;
      pBVar21->next = pBVar22;
      pBVar22 = pBVar21;
    } while (pBVar6 != (Type)0x0);
    localInitializedTempSym.head = (Type_conflict)0x0;
    *(BVSparseNode **)&localInitializedTempSym.lastFoundIndex[5].startIndex = pBVar21;
    localInitializedTempSym.alloc = (Type)&localAlloc.super_JitArenaAllocator.bvFreeList;
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_110);
  return;
}

Assistant:

void
Lowerer::Lower()
{

    this->m_func->StopMaintainByteCodeOffset();

    NoRecoverMemoryJitArenaAllocator localAlloc(_u("BE-Lower"), this->m_func->m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);
    this->m_alloc = &localAlloc;
    BVSparse<JitArenaAllocator> localInitializedTempSym(&localAlloc);
    this->initializedTempSym = &localInitializedTempSym;
    BVSparse<JitArenaAllocator> localAddToLiveOnBackEdgeSyms(&localAlloc);
    this->addToLiveOnBackEdgeSyms = &localAddToLiveOnBackEdgeSyms;
    Assert(this->m_func->GetCloneMap() == nullptr);

    m_lowererMD.Init(this);

    bool defaultDoFastPath = this->m_func->DoFastPaths();
    bool loopFastPath = this->m_func->DoLoopFastPaths();

    if (m_func->HasAnyStackNestedFunc())
    {
        EnsureStackFunctionListStackSym();
    }
    if (m_func->DoStackFrameDisplay() && !m_func->IsLoopBody())
    {
        AllocStackClosure();
    }

    AllocStackForInObjectEnumeratorArray();

    if (m_func->IsJitInDebugMode())
    {
        // Initialize metadata of local var slots.
        // Too late to wait until Register Allocator, as we need the offset when lowerering bailout for debugger.
        int32 hasLocalVarChangedOffset = m_func->GetHasLocalVarChangedOffset();
        if (hasLocalVarChangedOffset != Js::Constants::InvalidOffset)
        {
            // MOV [EBP + m_func->GetHasLocalVarChangedOffset()], 0
            StackSym* sym = StackSym::New(TyInt8, m_func);
            sym->m_offset = hasLocalVarChangedOffset;
            sym->m_allocated = true;
            IR::Opnd* opnd1 = IR::SymOpnd::New(sym, TyInt8, m_func);
            IR::Opnd* opnd2 = IR::IntConstOpnd::New(0, TyInt8, m_func);
            Lowerer::InsertMove(opnd1, opnd2, m_func->GetFunctionEntryInsertionPoint());

#ifdef DBG
            // Pre-fill all local slots with a pattern. This will help identify non-initialized/garbage var values.
            // Note that in the beginning of the function in bytecode we should initialize all locals to undefined.
            uint32 localSlotCount = m_func->GetJITFunctionBody()->GetEndNonTempLocalIndex() - m_func->GetJITFunctionBody()->GetFirstNonTempLocalIndex();
            for (uint i = 0; i < localSlotCount; ++i)
            {
                int offset = m_func->GetLocalVarSlotOffset(i);

                IRType opnd1Type;

#if defined(TARGET_32)
                opnd1Type = TyInt32;
                opnd2 = IR::IntConstOpnd::New(Func::c_debugFillPattern4, opnd1Type, m_func);
#else
                opnd1Type = TyInt64;
                opnd2 = IR::IntConstOpnd::New(Func::c_debugFillPattern8, opnd1Type, m_func);
#endif

                sym = StackSym::New(opnd1Type, m_func);
                sym->m_offset = offset;
                sym->m_allocated = true;
                opnd1 = IR::SymOpnd::New(sym, opnd1Type, m_func);
                Lowerer::InsertMove(opnd1, opnd2, m_func->GetFunctionEntryInsertionPoint());
            }
#endif
        }

        Assert(!m_func->HasAnyStackNestedFunc());
    }

    this->LowerRange(m_func->m_headInstr, m_func->m_tailInstr, defaultDoFastPath, loopFastPath);

#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
    // TODO: (leish)(swb) implement for arm
#if defined(_M_IX86) || defined(_M_AMD64)
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
    {
        // find out all write barrier setting instr, call Recycler::WBSetBit for verification purpose
        // should do this in LowererMD::GenerateWriteBarrier, however, can't insert call instruction there
        FOREACH_INSTR_EDITING(instr, instrNext, m_func->m_headInstr)
            if (instr->m_src1 && instr->m_src1->IsAddrOpnd())
            {
                IR::AddrOpnd* addrOpnd = instr->m_src1->AsAddrOpnd();
                if (addrOpnd->GetAddrOpndKind() == IR::AddrOpndKindWriteBarrierCardTable)
                {
                    auto& leaInstr = instr->m_prev->m_prev->m_prev;
                    auto& movInstr = instr->m_prev->m_prev;
                    auto& shrInstr = instr->m_prev;
                    Assert(leaInstr->m_opcode == Js::OpCode::LEA);
                    Assert(movInstr->m_opcode == Js::OpCode::MOV);
                    Assert(shrInstr->m_opcode == Js::OpCode::SHR);
                    m_lowererMD.LoadHelperArgument(movInstr, leaInstr->m_dst);
                    IR::Instr* instrCall = IR::Instr::New(Js::OpCode::Call, m_func);
                    movInstr->InsertBefore(instrCall);
                    m_lowererMD.ChangeToHelperCall(instrCall, IR::HelperWriteBarrierSetVerifyBit);
                }
            }
        NEXT_INSTR_EDITING
    }
#endif
#endif

    this->m_func->ClearCloneMap();

    if (m_func->HasAnyStackNestedFunc())
    {
        EnsureZeroLastStackFunctionNext();
    }

    if (!m_func->IsSimpleJit())
    {
#if 0 // TODO michhol oop jit, reenable assert
        Js::EntryPointInfo* entryPointInfo = this->m_func->m_workItem->GetEntryPoint();
        Assert(entryPointInfo->GetJitTransferData() != nullptr && !entryPointInfo->GetJitTransferData()->GetIsReady());
#endif
    }

    this->initializedTempSym = nullptr;
    this->m_alloc = nullptr;

    this->m_func->DisableConstandAddressLoadHoist();
}